

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httprpc.cpp
# Opt level: O1

void StopHTTPRPC(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  unique_ptr<HTTPRPCTimerInterface,_std::default_delete<HTTPRPCTimerInterface>_> uVar2;
  bool bVar3;
  int iVar4;
  Logger *this;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  string local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this = LogInstance();
  bVar3 = BCLog::Logger::WillLogCategoryLevel(this,RPC,Debug);
  if (bVar3) {
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/httprpc.cpp"
    ;
    source_file._M_len = 0x5b;
    logging_function._M_str = "StopHTTPRPC";
    logging_function._M_len = 0xb;
    LogPrintFormatInternal<>
              (logging_function,source_file,0x180,RPC,Debug,(ConstevalFormatString<0U>)0xfda330);
  }
  paVar1 = &local_38.field_2;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"/","");
  UnregisterHTTPHandler(&local_38,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  iVar4 = (**g_wallet_init_interface->_vptr_WalletInitInterface)();
  if ((char)iVar4 != '\0') {
    local_38._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"/wallet/","");
    UnregisterHTTPHandler(&local_38,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != paVar1) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  if ((__uniq_ptr_impl<HTTPRPCTimerInterface,_std::default_delete<HTTPRPCTimerInterface>_>)
      httpRPCTimerInterface._M_t.
      super___uniq_ptr_impl<HTTPRPCTimerInterface,_std::default_delete<HTTPRPCTimerInterface>_>._M_t
      .super__Tuple_impl<0UL,_HTTPRPCTimerInterface_*,_std::default_delete<HTTPRPCTimerInterface>_>.
      super__Head_base<0UL,_HTTPRPCTimerInterface_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<HTTPRPCTimerInterface,_std::default_delete<HTTPRPCTimerInterface>_>)0x0) {
    RPCUnsetTimerInterface
              ((RPCTimerInterface *)
               httpRPCTimerInterface._M_t.
               super___uniq_ptr_impl<HTTPRPCTimerInterface,_std::default_delete<HTTPRPCTimerInterface>_>
               ._M_t.
               super__Tuple_impl<0UL,_HTTPRPCTimerInterface_*,_std::default_delete<HTTPRPCTimerInterface>_>
               .super__Head_base<0UL,_HTTPRPCTimerInterface_*,_false>._M_head_impl);
    uVar2 = httpRPCTimerInterface;
    httpRPCTimerInterface._M_t.
    super___uniq_ptr_impl<HTTPRPCTimerInterface,_std::default_delete<HTTPRPCTimerInterface>_>._M_t.
    super__Tuple_impl<0UL,_HTTPRPCTimerInterface_*,_std::default_delete<HTTPRPCTimerInterface>_>.
    super__Head_base<0UL,_HTTPRPCTimerInterface_*,_false>._M_head_impl =
         (__uniq_ptr_data<HTTPRPCTimerInterface,_std::default_delete<HTTPRPCTimerInterface>,_true,_true>
          )(__uniq_ptr_impl<HTTPRPCTimerInterface,_std::default_delete<HTTPRPCTimerInterface>_>)0x0;
    if ((__uniq_ptr_impl<HTTPRPCTimerInterface,_std::default_delete<HTTPRPCTimerInterface>_>)
        uVar2._M_t.
        super___uniq_ptr_impl<HTTPRPCTimerInterface,_std::default_delete<HTTPRPCTimerInterface>_>.
        _M_t.
        super__Tuple_impl<0UL,_HTTPRPCTimerInterface_*,_std::default_delete<HTTPRPCTimerInterface>_>
        .super__Head_base<0UL,_HTTPRPCTimerInterface_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<HTTPRPCTimerInterface,_std::default_delete<HTTPRPCTimerInterface>_>)0x0) {
      (**(code **)(*(long *)uVar2._M_t.
                            super___uniq_ptr_impl<HTTPRPCTimerInterface,_std::default_delete<HTTPRPCTimerInterface>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_HTTPRPCTimerInterface_*,_std::default_delete<HTTPRPCTimerInterface>_>
                            .super__Head_base<0UL,_HTTPRPCTimerInterface_*,_false>._M_head_impl + 8)
      )();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void StopHTTPRPC()
{
    LogDebug(BCLog::RPC, "Stopping HTTP RPC server\n");
    UnregisterHTTPHandler("/", true);
    if (g_wallet_init_interface.HasWalletSupport()) {
        UnregisterHTTPHandler("/wallet/", false);
    }
    if (httpRPCTimerInterface) {
        RPCUnsetTimerInterface(httpRPCTimerInterface.get());
        httpRPCTimerInterface.reset();
    }
}